

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O0

bool P_ActivateThingSpecial(AActor *thing,AActor *trigger,bool death)

{
  int iVar1;
  AActor *local_28;
  bool local_1a;
  bool res;
  bool death_local;
  AActor *trigger_local;
  AActor *thing_local;
  
  local_1a = false;
  if ((thing->activationtype & 2U) != 0) {
    TObjPtr<AActor>::operator=(&thing->target,trigger);
  }
  if ((thing->activationtype & 4U) != 0) {
    TObjPtr<AActor>::operator=(&trigger->target,thing);
  }
  if ((!death) && ((thing->activationtype & 0x700U) != 0)) {
    if (((thing->activationtype & 0x400U) != 0) && ((thing->activationtype & 0x300U) == 0)) {
      thing->activationtype = thing->activationtype | 0x100;
    }
    if ((thing->activationtype & 0x100U) == 0) {
      if ((thing->activationtype & 0x200U) != 0) {
        thing->activationtype = thing->activationtype & 0xfffffdff;
        if ((thing->activationtype & 0x400U) != 0) {
          thing->activationtype = thing->activationtype | 0x100;
        }
        AActor::CallDeactivate(thing,trigger);
        local_1a = true;
      }
    }
    else {
      thing->activationtype = thing->activationtype & 0xfffffeff;
      if ((thing->activationtype & 0x400U) != 0) {
        thing->activationtype = thing->activationtype | 0x200;
      }
      AActor::CallActivate(thing,trigger);
      local_1a = true;
    }
  }
  if (thing->special != 0) {
    local_28 = thing;
    if ((((!death) || ((level.flags & 0x800) == 0)) || ((thing->activationtype & 0x80U) != 0)) &&
       ((thing->activationtype & 1U) == 0)) {
      local_28 = trigger;
    }
    iVar1 = P_ExecuteSpecial(thing->special,(line_t *)0x0,local_28,false,thing->args[0],
                             thing->args[1],thing->args[2],thing->args[3],thing->args[4]);
    local_1a = iVar1 != 0;
    if ((death) || (((thing->activationtype & 0x20U) != 0 && (local_1a)))) {
      thing->special = 0;
    }
  }
  return local_1a;
}

Assistant:

bool P_ActivateThingSpecial(AActor * thing, AActor * trigger, bool death)
{
	bool res = false;

	// Target switching mechanism
	if (thing->activationtype & THINGSPEC_ThingTargets)		thing->target = trigger;
	if (thing->activationtype & THINGSPEC_TriggerTargets)	trigger->target = thing;

	// State change mechanism. The thing needs to be not dead and to have at least one of the relevant flags
	if (!death && (thing->activationtype & (THINGSPEC_Activate | THINGSPEC_Deactivate | THINGSPEC_Switch)))
	{
		// If a switchable thing does not know whether it should be activated
		// or deactivated, the default is to activate it.
		if ((thing->activationtype & THINGSPEC_Switch)
			&& !(thing->activationtype & (THINGSPEC_Activate | THINGSPEC_Deactivate)))
		{
			thing->activationtype |= THINGSPEC_Activate;
		}
		// Can it be activated?
		if (thing->activationtype & THINGSPEC_Activate)
		{
			thing->activationtype &= ~THINGSPEC_Activate; // Clear flag
			if (thing->activationtype & THINGSPEC_Switch) // Set other flag if switching
				thing->activationtype |= THINGSPEC_Deactivate;
			thing->CallActivate(trigger);
			res = true;
		}
		// If not, can it be deactivated?
		else if (thing->activationtype & THINGSPEC_Deactivate)
		{
			thing->activationtype &= ~THINGSPEC_Deactivate; // Clear flag
			if (thing->activationtype & THINGSPEC_Switch)	// Set other flag if switching
				thing->activationtype |= THINGSPEC_Activate;
			thing->CallDeactivate(trigger);
			res = true;
		}
	}

	// Run the special, if any
	if (thing->special)
	{
		res = !!P_ExecuteSpecial(thing->special, NULL,
			// TriggerActs overrides the level flag, which only concerns thing activated by death
			(((death && level.flags & LEVEL_ACTOWNSPECIAL && !(thing->activationtype & THINGSPEC_TriggerActs))
			|| (thing->activationtype & THINGSPEC_ThingActs)) // Who triggers?
			? thing : trigger),
			false, thing->args[0], thing->args[1], thing->args[2], thing->args[3], thing->args[4]);

		// Clears the special if it was run on thing's death or if flag is set.
		if (death || (thing->activationtype & THINGSPEC_ClearSpecial && res)) thing->special = 0;
	}

	// Returns the result
	return res;
}